

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rkvstore_describe_price.cc
# Opt level: O0

void anon_unknown.dwarf_5778e::Json2Type(Value *value,RkvstoreDescribePriceOrderType *item)

{
  bool bVar1;
  Value *pVVar2;
  float fVar3;
  Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19;
  RkvstoreDescribePriceOrderType *local_18;
  RkvstoreDescribePriceOrderType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RkvstoreDescribePriceOrderType *)value;
  bVar1 = Json::Value::isMember(value,"OriginalAmount");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"OriginalAmount");
    fVar3 = Json::Value::asFloat(pVVar2);
    local_18->original_amount = fVar3;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"TradeAmount");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"TradeAmount");
    fVar3 = Json::Value::asFloat(pVVar2);
    local_18->trade_amount = fVar3;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DiscountAmount");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DiscountAmount");
    fVar3 = Json::Value::asFloat(pVVar2);
    local_18->discount_amount = fVar3;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RuleIds");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"RuleIds");
    bVar1 = Json::Value::isMember(pVVar2,"RuleId");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"RuleIds");
      pVVar2 = Json::Value::operator[](pVVar2,"RuleId");
      Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Json2Array(&local_19,pVVar2,&local_18->rule_ids);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RkvstoreDescribePriceOrderType* item) {
  if(value.isMember("OriginalAmount")) {
    item->original_amount = value["OriginalAmount"].asFloat();
  }
  if(value.isMember("TradeAmount")) {
    item->trade_amount = value["TradeAmount"].asFloat();
  }
  if(value.isMember("DiscountAmount")) {
    item->discount_amount = value["DiscountAmount"].asFloat();
  }
  if(value.isMember("RuleIds")  && value["RuleIds"].isMember("RuleId")) {
    Json2Array<std::string>(value["RuleIds"]["RuleId"], &item->rule_ids);
  }
}